

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O2

void libkqueue_pre_fork(void)

{
  libkqueue_fork_cleanup_active = libkqueue_fork_cleanup;
  if (libkqueue_fork_cleanup) {
    pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
    return;
  }
  return;
}

Assistant:

TSAN_IGNORE
void
libkqueue_pre_fork(void)
{
    /*
     * Unfortunately there's no way to remove the atfork
     * handlers, so all we can do if cleanup is
     * deactivated is bail as quickly as possible.
     *
     * We copy the value of libkqueue_fork_cleanup so
     * that it's consistent during the fork.
     */
    libkqueue_fork_cleanup_active = libkqueue_fork_cleanup;
    if (!libkqueue_fork_cleanup_active)
        return;

    /*
     * Ensure that all global structures are in a consistent
     * state before attempting the fork.
     *
     * If we don't do this then kq_mtx state will
     * be undefined when the child starts cleaning
     * up resources, and we could get deadlocks, nasty
     * memory corruption and/or crashes in the child.
     *
     * We always lock the kq_mtx even when
     * !libkqueue_thread_safe because it's still locked when
     * kqueues are being freed, and we don't want to access
     * freed memory when attempting to perform cleanup.
     */
    tracing_mutex_lock(&kq_mtx);

    /*
     * We previously attempted to lock all the child
     * kqueues, but when they were waiting in kevent_wait
     * this caused fork to stall.
     *
     * The main reason for locking the child kqueues was
     * to ensure filters and kqueues were in a consistent
     * state at the time of the fork, to ensure we could
     * free resources correctly... but as it was later
     * discovered many systems really don't like free()
     * being called in the forked child, so we were limited
     * to async-safe calls like close... These should be
     * safe no matter what the state of the kqueues so
     * the locking was removed.
     */
}